

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPage::setButtonText(QWizardPage *this,WizardButton which,QString *text)

{
  long lVar1;
  QWizardPagePrivate *this_00;
  iterator this_01;
  QWizard *pQVar2;
  QWizardPrivate *pQVar3;
  int in_ESI;
  QWizard *in_RDI;
  long in_FS_OFFSET;
  QWizardPagePrivate *d;
  int *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizardPage *)0x7bd2f3);
  this_01._M_node =
       (_Base_ptr)
       QMap<int,_QString>::insert
                 ((QMap<int,_QString> *)this_00,in_stack_ffffffffffffffc8,(QString *)in_RDI);
  pQVar2 = wizard((QWizardPage *)in_RDI);
  if (pQVar2 != (QWizard *)0x0) {
    wizard((QWizardPage *)in_RDI);
    pQVar2 = (QWizard *)QWizard::currentPage(in_RDI);
    if (pQVar2 == in_RDI) {
      wizard((QWizardPage *)in_RDI);
      pQVar3 = QWizard::d_func((QWizard *)0x7bd35e);
      if (*(long *)((long)&pQVar3->field_20 + (long)in_ESI * 8) != 0) {
        wizard((QWizardPage *)in_RDI);
        QWizard::d_func((QWizard *)0x7bd380);
        QAbstractButton::setText((QAbstractButton *)this_01._M_node,(QString *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setButtonText(QWizard::WizardButton which, const QString &text)
{
    Q_D(QWizardPage);
    d->buttonCustomTexts.insert(which, text);
    if (wizard() && wizard()->currentPage() == this && wizard()->d_func()->btns[which])
        wizard()->d_func()->btns[which]->setText(text);
}